

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::shaderexecutor::createFuncGroup(PrecisionTestContext *ctx,CaseFactory *factory)

{
  TestContext *testCtx;
  FloatFormat *floatFormat_;
  FloatFormat *highpFormat_;
  TestNode *pTVar1;
  char *pcVar2;
  char *description;
  FloatFormat **ppFVar3;
  size_type sVar4;
  const_reference pvVar5;
  TestNode *node;
  MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> local_1c8;
  undefined1 local_1b8 [8];
  CaseContext caseCtx;
  undefined1 local_110 [8];
  string name;
  undefined1 local_e8 [8];
  string shaderName;
  ulong uStack_c0;
  ShaderType shaderType;
  size_t shaderNdx;
  FloatFormat *highpFmt;
  FloatFormat *fmt;
  undefined1 local_a0 [8];
  string precName;
  Precision local_78;
  Precision precision;
  int precNdx;
  string local_40 [32];
  TestNode *local_20;
  TestCaseGroup *group;
  CaseFactory *factory_local;
  PrecisionTestContext *ctx_local;
  
  group = (TestCaseGroup *)factory;
  factory_local = (CaseFactory *)ctx;
  pTVar1 = (TestNode *)operator_new(0x70);
  testCtx = (TestContext *)factory_local->_vptr_CaseFactory;
  (*(group->super_TestNode)._vptr_TestNode[3])(local_40);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  (*(group->super_TestNode)._vptr_TestNode[4])(&precNdx);
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,testCtx,pcVar2,description);
  std::__cxx11::string::~string((string *)&precNdx);
  std::__cxx11::string::~string(local_40);
  local_20 = pTVar1;
  for (local_78 = PRECISION_MEDIUMP; (int)local_78 < 3; local_78 = local_78 + PRECISION_MEDIUMP) {
    precName.field_2._12_4_ = local_78;
    pcVar2 = glu::getPrecisionName(local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,pcVar2,(allocator<char> *)((long)&fmt + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&fmt + 7));
    ppFVar3 = de::getSizedArrayElement<3,3,tcu::FloatFormat_const*>
                        ((FloatFormat *(*) [3])(factory_local + 1),local_78);
    floatFormat_ = *ppFVar3;
    ppFVar3 = de::getSizedArrayElement<3,3,tcu::FloatFormat_const*>
                        ((FloatFormat *(*) [3])(factory_local + 1),2);
    highpFormat_ = *ppFVar3;
    uStack_c0 = 0;
    while( true ) {
      sVar4 = std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::size
                        ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
                         (factory_local + 4));
      if (sVar4 <= uStack_c0) break;
      pvVar5 = std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::operator[]
                         ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
                          (factory_local + 4),uStack_c0);
      shaderName.field_2._12_4_ = *pvVar5;
      pcVar2 = glu::getShaderTypeName(shaderName.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e8,pcVar2,(allocator<char> *)(name.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &caseCtx.numRandoms,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &caseCtx.numRandoms,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
      std::__cxx11::string::~string((string *)&caseCtx.numRandoms);
      CaseContext::CaseContext
                ((CaseContext *)local_1b8,(string *)local_110,
                 (TestContext *)factory_local->_vptr_CaseFactory,floatFormat_,highpFormat_,
                 precName.field_2._12_4_,shaderName.field_2._12_4_,
                 (long)*(int *)&factory_local[7]._vptr_CaseFactory);
      pTVar1 = local_20;
      (*(group->super_TestNode)._vptr_TestNode[2])(&local_1c8,group,local_1b8);
      node = de::details::MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>::release
                       (&local_1c8);
      tcu::TestNode::addChild(pTVar1,node);
      de::details::MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>::~MovePtr(&local_1c8);
      CaseContext::~CaseContext((CaseContext *)local_1b8);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)local_e8);
      uStack_c0 = uStack_c0 + 1;
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  return (TestCaseGroup *)local_20;
}

Assistant:

TestCaseGroup* createFuncGroup (const PrecisionTestContext&	ctx, const CaseFactory& factory)
{
	TestCaseGroup* const	group	= new TestCaseGroup(ctx.testCtx, factory.getName().c_str(), factory.getDesc().c_str());

	for (int precNdx = glu::PRECISION_MEDIUMP; precNdx < glu::PRECISION_LAST; ++precNdx)
	{
		const Precision		precision	= Precision(precNdx);
		const string		precName	(glu::getPrecisionName(precision));
		const FloatFormat&	fmt			= *de::getSizedArrayElement<glu::PRECISION_LAST>(ctx.formats, precNdx);
		const FloatFormat&	highpFmt	= *de::getSizedArrayElement<glu::PRECISION_LAST>(ctx.formats,
																						 glu::PRECISION_HIGHP);

		for (size_t shaderNdx = 0; shaderNdx < ctx.shaderTypes.size(); ++shaderNdx)
		{
			const ShaderType	shaderType	= ctx.shaderTypes[shaderNdx];
			const string		shaderName	(glu::getShaderTypeName(shaderType));
			const string		name		= precName + "_" + shaderName;
			const CaseContext	caseCtx		(name, ctx.testCtx, fmt, highpFmt,
											 precision, shaderType, ctx.numRandoms);

			group->addChild(factory.createCase(caseCtx).release());
		}
	}

	return group;
}